

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.h
# Opt level: O0

void __thiscall LEFReader::~LEFReader(LEFReader *this)

{
  LEFReader *this_local;
  
  this->_vptr_LEFReader = (_func_int **)&PTR__LEFReader_001a3278;
  std::__cxx11::string::~string((string *)&this->m_tokstr);
  return;
}

Assistant:

virtual ~LEFReader() {}